

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAudio_internal.c
# Opt level: O1

void FAudio_INTERNAL_GenerateOutput(FAudio *audio,float *output)

{
  uint32_t *puVar1;
  uint64_t *puVar2;
  float fVar3;
  ushort uVar4;
  uint32_t uVar5;
  FAudioFilterType FVar6;
  code *pcVar7;
  FAudioMasteringVoice *pFVar8;
  FAudioSourceVoice *voice;
  FAudioVoice *pFVar9;
  FAudioVoiceCallback *pFVar10;
  FAudioBufferEntry *pFVar11;
  OnBufferEndFunc p_Var12;
  OnStreamEndFunc p_Var13;
  OnBufferStartFunc p_Var14;
  uint64_t uVar15;
  FAudioFilterState *pafVar16;
  FAudioVoice *pFVar17;
  uint uVar18;
  uint uVar19;
  FAudioWaveFormatEx *pFVar20;
  float *pfVar21;
  ulong uVar22;
  float **ppfVar23;
  float *pfVar24;
  ulong uVar25;
  FAudioBufferEntry *pFVar26;
  FAudioFilterParameters *pFVar27;
  FAudioVoice **ppFVar28;
  FAudio *pFVar29;
  LinkedList *pLVar30;
  uint uVar31;
  ulong uVar33;
  int iVar34;
  int iVar35;
  long lVar36;
  uint32_t uVar37;
  ulong uVar38;
  bool bVar39;
  float fVar40;
  float fVar41;
  uint32_t totalSamples;
  uint32_t resampled;
  uint64_t local_60;
  ulong local_58;
  LinkedList *local_50;
  uint local_44;
  FAudio *local_40;
  float *local_38;
  uint uVar32;
  
  if (audio->active != '\0') {
    FAudio_OPERATIONSET_Execute(audio);
    FAudio_PlatformLockMutex(audio->callbackLock);
    for (pLVar30 = audio->callbacks; pLVar30 != (LinkedList *)0x0; pLVar30 = pLVar30->next) {
      pcVar7 = *(code **)((long)pLVar30->entry + 0x10);
      if (pcVar7 != (code *)0x0) {
        (*pcVar7)();
      }
    }
    FAudio_PlatformUnlockMutex(audio->callbackLock);
    pFVar8 = audio->master;
    pfVar21 = (pFVar8->field_19).mix.inputCache;
    local_38 = output;
    if (pfVar21 == (float *)0x0) {
      (pFVar8->field_19).master.output = output;
    }
    else {
      (pFVar8->field_19).master.output = pfVar21;
      SDL_memset((audio->master->field_19).mix.inputCache,0,
                 (ulong)(audio->master->field_19).master.inputChannels * (ulong)audio->updateSize *
                 4);
    }
    FAudio_PlatformLockMutex(audio->sourceLock);
    local_40 = audio;
    for (pLVar30 = audio->sources; pLVar30 != (LinkedList *)0x0; pLVar30 = pLVar30->next) {
      voice = (FAudioSourceVoice *)pLVar30->entry;
      audio->processingSource = voice;
      FAudio_INTERNAL_FlushPendingBuffers(voice);
      pFVar9 = audio->processingSource;
      if ((pFVar9->field_19).src.active != '\0') {
        FAudio_PlatformLockMutex(pFVar9->sendLock);
        fVar3 = (pFVar9->field_19).src.resampleFreq;
        pFVar20 = (pFVar9->field_19).src.format;
        fVar40 = (pFVar9->field_19).src.freqRatio;
        fVar41 = (float)pFVar20->nSamplesPerSec * fVar40;
        if ((fVar3 != fVar41) || (NAN(fVar3) || NAN(fVar41))) {
          if ((pFVar9->sends).SendCount == 0) {
            ppFVar28 = &pFVar9->audio->master;
          }
          else {
            ppFVar28 = &((pFVar9->sends).pSends)->pOutputVoice;
          }
          fVar3 = (((float)pFVar20->nSamplesPerSec * fVar40) /
                  (float)*(uint *)((long)&(*ppFVar28)->field_19 +
                                  (ulong)((*ppFVar28)->type != FAUDIO_VOICE_MASTER) * 0x10 + 0x14))
                  * 4.2949673e+09 + 0.5;
          uVar25 = (ulong)fVar3;
          (pFVar9->field_19).src.resampleStep =
               (long)(fVar3 - 9.223372e+18) & (long)uVar25 >> 0x3f | uVar25;
          (pFVar9->field_19).src.resampleFreq = (float)pFVar20->nSamplesPerSec * fVar40;
        }
        if ((pFVar9->field_19).src.active == '\x02') {
          pFVar29 = pFVar9->audio;
LAB_0011978f:
          uVar18 = (uint)pFVar20->nChannels * (pFVar9->field_19).src.resampleSamples;
          local_50 = pLVar30;
          if (pFVar29->resampleSamples < uVar18) {
            pFVar29->resampleSamples = uVar18;
            pfVar21 = (float *)(*pFVar29->pRealloc)(pFVar29->resampleCache,(ulong)uVar18 << 2);
            pFVar29->resampleCache = pfVar21;
          }
          uVar37 = (pFVar9->field_19).src.resampleSamples;
          local_60 = CONCAT44(local_60._4_4_,uVar37);
          SDL_memset(pFVar9->audio->resampleCache,0,
                     (ulong)(((pFVar9->field_19).src.format)->nChannels * uVar37) << 2);
          pfVar21 = pFVar9->audio->resampleCache;
LAB_00119f35:
          if ((pFVar9->flags & 8) != 0) {
            FAudio_PlatformLockMutex(pFVar9->filterLock);
            if ((uint)local_60 != 0) {
              pafVar16 = pFVar9->filterState;
              uVar4 = ((pFVar9->field_19).src.format)->nChannels;
              uVar25 = 0;
              iVar35 = 0;
              do {
                iVar34 = (int)uVar25;
                if (uVar4 != 0) {
                  FVar6 = (pFVar9->filter).Type;
                  lVar36 = 0;
                  do {
                    fVar3 = *(float *)((long)*pafVar16 + lVar36 + 4);
                    fVar40 = (pFVar9->filter).Frequency * fVar3 +
                             *(float *)((long)*pafVar16 + lVar36);
                    *(float *)((long)*pafVar16 + lVar36) = fVar40;
                    fVar41 = (pfVar21[uVar25] - fVar40) - (pFVar9->filter).OneOverQ * fVar3;
                    *(float *)((long)*pafVar16 + lVar36 + 8) = fVar41;
                    *(float *)((long)*pafVar16 + lVar36 + 4) =
                         fVar41 * (pFVar9->filter).Frequency + fVar3;
                    *(float *)((long)*pafVar16 + lVar36 + 0xc) = fVar40 + fVar41;
                    pfVar21[uVar25] = *(float *)((long)*pafVar16 + lVar36 + (ulong)FVar6 * 4);
                    lVar36 = lVar36 + 0x10;
                    uVar25 = (ulong)((int)uVar25 + 1);
                  } while ((ulong)uVar4 << 4 != lVar36);
                }
                iVar35 = iVar35 + 1;
                uVar25 = (ulong)(iVar34 + (uint)uVar4);
              } while (iVar35 != (uint)local_60);
            }
            FAudio_PlatformUnlockMutex(pFVar9->filterLock);
          }
          FAudio_PlatformLockMutex(pFVar9->effectLock);
          if ((pFVar9->effects).count != 0) {
            uVar18 = (pFVar9->field_19).src.resampleSamples;
            iVar35 = uVar18 - (uint)local_60;
            if ((uint)local_60 <= uVar18 && iVar35 != 0) {
              uVar18 = (uint)((pFVar9->field_19).src.format)->nChannels;
              SDL_memset(pfVar21 + (uint)local_60 * uVar18,0,(ulong)(iVar35 * uVar18) << 2);
              local_60 = CONCAT44(local_60._4_4_,(pFVar9->field_19).src.resampleSamples);
            }
            pfVar21 = FAudio_INTERNAL_ProcessEffectChain(pFVar9,pfVar21,(uint32_t *)&local_60);
          }
          FAudio_PlatformUnlockMutex(pFVar9->effectLock);
          if ((pFVar9->sends).SendCount != 0) {
            FAudio_PlatformLockMutex(pFVar9->volumeLock);
            if ((pFVar9->sends).SendCount != 0) {
              uVar25 = 0;
              do {
                pFVar17 = (pFVar9->sends).pSends[uVar25].pOutputVoice;
                bVar39 = pFVar17->type != FAUDIO_VOICE_MASTER;
                pfVar24 = *(float **)((long)&pFVar17->field_19 + (ulong)bVar39 * 8);
                uVar37 = *(uint32_t *)((long)&pFVar17->field_19 + (ulong)bVar39 * 0x10 + 0x10);
                (*pFVar9->sendMix[uVar25])
                          ((uint)local_60,pFVar9->outputChannels,uVar37,pfVar21,pfVar24,
                           pFVar9->mixCoefficients[uVar25]);
                if ((((pFVar9->sends).pSends[uVar25].Flags & 0x80) != 0) && ((uint)local_60 != 0)) {
                  pFVar27 = pFVar9->sendFilter + uVar25;
                  pafVar16 = pFVar9->sendFilterState[uVar25];
                  uVar18 = uVar37 & 0xffff;
                  uVar33 = 0;
                  iVar35 = 0;
                  do {
                    iVar34 = (int)uVar33;
                    if (uVar18 != 0) {
                      FVar6 = pFVar27->Type;
                      uVar38 = 0;
                      do {
                        fVar3 = *(float *)((long)*pafVar16 + uVar38 + 4);
                        fVar40 = pFVar27->Frequency * fVar3 + *(float *)((long)*pafVar16 + uVar38);
                        *(float *)((long)*pafVar16 + uVar38) = fVar40;
                        fVar41 = (pfVar24[uVar33] - fVar40) - pFVar27->OneOverQ * fVar3;
                        *(float *)((long)*pafVar16 + uVar38 + 8) = fVar41;
                        *(float *)((long)*pafVar16 + uVar38 + 4) =
                             fVar41 * pFVar27->Frequency + fVar3;
                        *(float *)((long)*pafVar16 + uVar38 + 0xc) = fVar40 + fVar41;
                        pfVar24[uVar33] = *(float *)((long)*pafVar16 + uVar38 + (ulong)FVar6 * 4);
                        uVar38 = uVar38 + 0x10;
                        uVar33 = (ulong)((int)uVar33 + 1);
                      } while (uVar18 << 4 != uVar38);
                    }
                    iVar35 = iVar35 + 1;
                    uVar33 = (ulong)(iVar34 + uVar18);
                  } while (iVar35 != (uint)local_60);
                }
                uVar25 = uVar25 + 1;
              } while (uVar25 < (pFVar9->sends).SendCount);
            }
            FAudio_PlatformUnlockMutex(pFVar9->volumeLock);
          }
          FAudio_PlatformUnlockMutex(pFVar9->sendLock);
          pLVar30 = local_50;
          audio = local_40;
        }
        else {
          uVar25 = (pFVar9->field_19).src.curBufferOffsetDec + 0xffffffff +
                   (ulong)(pFVar9->field_19).src.resampleSamples *
                   (pFVar9->field_19).src.resampleStep;
          uVar33 = uVar25 >> 0x20;
          pFVar10 = (pFVar9->field_19).src.callback;
          if ((pFVar10 != (FAudioVoiceCallback *)0x0) &&
             (pFVar10->OnVoiceProcessingPassStart != (OnVoiceProcessingPassStartFunc)0x0)) {
            FAudio_PlatformUnlockMutex(pFVar9->sendLock);
            FAudio_PlatformUnlockMutex(pFVar9->audio->sourceLock);
            pFVar26 = (pFVar9->field_19).src.bufferList;
            uVar38 = uVar33;
            uVar22 = uVar33;
            if (uVar33 != 0 && pFVar26 != (FAudioBufferEntry *)0x0) {
              while( true ) {
                uVar37 = (pFVar26->buffer).LoopCount;
                if (uVar37 == 0) {
                  uVar18 = ((pFVar26->buffer).PlayLength + (pFVar26->buffer).PlayBegin) -
                           (pFVar9->field_19).src.curBufferOffset;
                }
                else {
                  uVar5 = (pFVar26->buffer).LoopLength;
                  uVar18 = ~(pFVar9->field_19).src.curBufferOffset +
                           uVar5 + (pFVar26->buffer).LoopBegin + uVar37 * uVar5 +
                           (pFVar26->buffer).PlayLength;
                }
                uVar19 = (uint)uVar22 - uVar18;
                uVar38 = (ulong)uVar19;
                if ((uint)uVar22 < uVar18) break;
                pFVar26 = pFVar26->next;
                if ((pFVar26 == (FAudioBufferEntry *)0x0) || (uVar22 = uVar38, uVar19 == 0))
                goto LAB_001198c7;
              }
              uVar38 = 0;
            }
LAB_001198c7:
            iVar35 = (int)uVar38;
            pFVar10 = (pFVar9->field_19).src.callback;
            pFVar20 = (pFVar9->field_19).src.format;
            if (pFVar20->wFormatTag == 2) {
              iVar35 = ((int)(uVar38 / pFVar20[1].wFormatTag) + 1) -
                       (uint)((int)(uVar38 % (ulong)pFVar20[1].wFormatTag) == 0);
            }
            (*pFVar10->OnVoiceProcessingPassStart)(pFVar10,(uint)pFVar20->nBlockAlign * iVar35);
            FAudio_PlatformLockMutex(pFVar9->audio->sourceLock);
            FAudio_PlatformLockMutex(pFVar9->sendLock);
          }
          FAudio_PlatformLockMutex((pFVar9->field_19).src.bufferLock);
          pFVar26 = (pFVar9->field_19).src.bufferList;
          if (pFVar26 == (FAudioBufferEntry *)0x0) {
            FAudio_PlatformUnlockMutex((pFVar9->field_19).src.bufferLock);
            if (((pFVar9->effects).count != 0) && ((pFVar9->effects).state != FAPO_BUFFER_SILENT)) {
              pFVar29 = pFVar9->audio;
              pFVar20 = (pFVar9->field_19).src.format;
              goto LAB_0011978f;
            }
            FAudio_PlatformUnlockMutex(pFVar9->sendLock);
            FAudio_PlatformUnlockMutex(pFVar9->audio->sourceLock);
            pFVar10 = (pFVar9->field_19).src.callback;
            if ((pFVar10 != (FAudioVoiceCallback *)0x0) &&
               (pFVar10->OnVoiceProcessingPassEnd != (OnVoiceProcessingPassEndFunc)0x0)) {
              (*pFVar10->OnVoiceProcessingPassEnd)(pFVar10);
            }
            FAudio_PlatformLockMutex(pFVar9->audio->sourceLock);
          }
          else {
            if (uVar33 == 0) {
              bVar39 = true;
              uVar38 = 0;
              uVar22 = 0;
              local_50 = pLVar30;
            }
            else {
              uVar38 = 0;
              local_50 = pLVar30;
              do {
                if ((pFVar9->field_19).src.newBuffer != '\0') {
                  (pFVar9->field_19).src.newBuffer = '\0';
                  pFVar10 = (pFVar9->field_19).src.callback;
                  if ((pFVar10 != (FAudioVoiceCallback *)0x0) &&
                     (pFVar10->OnBufferStart != (OnBufferStartFunc)0x0)) {
                    FAudio_PlatformUnlockMutex(pFVar9->audio->sourceLock);
                    pFVar10 = (pFVar9->field_19).src.callback;
                    (*pFVar10->OnBufferStart)(pFVar10,(pFVar26->buffer).pContext);
                    FAudio_PlatformLockMutex(pFVar9->audio->sourceLock);
                  }
                }
                uVar32 = (uint)(uVar25 >> 0x20);
                uVar31 = uVar32 - (int)uVar38;
                uVar22 = (ulong)((pFVar26->buffer).LoopCount != 0);
                uVar19 = ((&(pFVar26->buffer).PlayLength)[uVar22 * 2] +
                         (&(pFVar26->buffer).PlayBegin)[uVar22 * 2]) -
                         (pFVar9->field_19).src.curBufferOffset;
                uVar18 = uVar31;
                if (uVar19 < uVar31) {
                  uVar18 = uVar19;
                }
                local_58 = uVar38;
                (*(pFVar9->field_19).src.decode)
                          (pFVar9,&pFVar26->buffer,
                           pFVar9->audio->decodeCache +
                           (uint)((pFVar9->field_19).src.format)->nChannels * (int)uVar38,uVar18);
                puVar1 = &(pFVar9->field_19).src.curBufferOffset;
                *puVar1 = *puVar1 + uVar18;
                puVar2 = &(pFVar9->field_19).src.totalSamples;
                *puVar2 = *puVar2 + (ulong)uVar18;
                uVar18 = (int)local_58 + uVar18;
                uVar22 = (ulong)uVar18;
                uVar38 = uVar22;
                local_58 = uVar22;
                if (uVar19 < uVar31) {
                  if ((pFVar26->buffer).LoopCount == 0) {
                    if (((pFVar26->buffer).Flags & 0x40) != 0) {
                      (pFVar9->field_19).src.curBufferOffsetDec = 0;
                      (pFVar9->field_19).src.totalSamples = 0;
                    }
                    pFVar11 = (pFVar9->field_19).src.bufferList;
                    pFVar26 = pFVar11->next;
                    (pFVar9->field_19).src.bufferList = pFVar26;
                    if (pFVar26 == (FAudioBufferEntry *)0x0) {
                      uVar4 = ((pFVar9->field_19).src.format)->nChannels;
                      SDL_memset(pFVar9->audio->decodeCache + uVar18 * uVar4,0,
                                 (uVar33 - uVar22) * (ulong)uVar4 * 4);
                      pFVar26 = (FAudioBufferEntry *)0x0;
                    }
                    else {
                      (pFVar9->field_19).src.curBufferOffset = (pFVar26->buffer).PlayBegin;
                    }
                    if ((pFVar9->field_19).src.callback != (FAudioVoiceCallback *)0x0) {
                      FAudio_PlatformUnlockMutex(pFVar9->audio->sourceLock);
                      pFVar10 = (pFVar9->field_19).src.callback;
                      p_Var12 = pFVar10->OnBufferEnd;
                      if (p_Var12 != (OnBufferEndFunc)0x0) {
                        (*p_Var12)(pFVar10,(pFVar11->buffer).pContext);
                      }
                      if (((pFVar11->buffer).Flags & 0x40) != 0) {
                        pFVar10 = (pFVar9->field_19).src.callback;
                        p_Var13 = pFVar10->OnStreamEnd;
                        if (p_Var13 != (OnStreamEndFunc)0x0) {
                          (*p_Var13)(pFVar10);
                        }
                      }
                      if (pFVar26 == (FAudioBufferEntry *)0x0) {
                        pFVar26 = (pFVar9->field_19).src.bufferList;
                        if (pFVar26 == (FAudioBufferEntry *)0x0) {
                          pFVar26 = (FAudioBufferEntry *)0x0;
                        }
                        else {
                          (pFVar9->field_19).src.curBufferOffset = (pFVar26->buffer).PlayBegin;
                        }
                      }
                      if (pFVar26 != (FAudioBufferEntry *)0x0) {
                        pFVar10 = (pFVar9->field_19).src.callback;
                        p_Var14 = pFVar10->OnBufferStart;
                        if (p_Var14 != (OnBufferStartFunc)0x0) {
                          (*p_Var14)(pFVar10,(pFVar26->buffer).pContext);
                        }
                      }
                      FAudio_PlatformLockMutex(pFVar9->audio->sourceLock);
                    }
                    (*pFVar9->audio->pFree)(pFVar11);
                    uVar38 = local_58;
                  }
                  else {
                    (pFVar9->field_19).src.curBufferOffset = (pFVar26->buffer).LoopBegin;
                    uVar18 = (pFVar26->buffer).LoopCount;
                    if (uVar18 < 0xff) {
                      (pFVar26->buffer).LoopCount = uVar18 - 1;
                    }
                    pFVar10 = (pFVar9->field_19).src.callback;
                    if ((pFVar10 != (FAudioVoiceCallback *)0x0) &&
                       (pFVar10->OnLoopEnd != (OnLoopEndFunc)0x0)) {
                      FAudio_PlatformUnlockMutex(pFVar9->audio->sourceLock);
                      pFVar10 = (pFVar9->field_19).src.callback;
                      (*pFVar10->OnLoopEnd)(pFVar10,(pFVar26->buffer).pContext);
                      FAudio_PlatformLockMutex(pFVar9->audio->sourceLock);
                    }
                  }
                }
                bVar39 = pFVar26 != (FAudioBufferEntry *)0x0;
              } while (((uint)uVar38 < uVar32) && (pFVar26 != (FAudioBufferEntry *)0x0));
            }
            iVar35 = (int)uVar38;
            if (bVar39) {
              uVar25 = (ulong)((pFVar26->buffer).LoopCount != 0);
              uVar18 = ((&(pFVar26->buffer).PlayLength)[uVar25 * 2] +
                       (&(pFVar26->buffer).PlayBegin)[uVar25 * 2]) -
                       (pFVar9->field_19).src.curBufferOffset;
              uVar37 = 2;
              if (uVar18 < 2) {
                uVar37 = uVar18;
              }
              (*(pFVar9->field_19).src.decode)
                        (pFVar9,&pFVar26->buffer,
                         pFVar9->audio->decodeCache +
                         (uint)((pFVar9->field_19).src.format)->nChannels * iVar35,uVar37);
              if (uVar18 < 2) {
                uVar18 = (uint)((pFVar9->field_19).src.format)->nChannels;
                pfVar21 = pFVar9->audio->decodeCache + iVar35 * uVar18;
                iVar35 = (uVar37 * -4 + 8) * uVar18;
                goto LAB_00119cdd;
              }
            }
            else {
              uVar18 = (uint)((pFVar9->field_19).src.format)->nChannels;
              pfVar21 = pFVar9->audio->decodeCache + iVar35 * uVar18;
              iVar35 = uVar18 << 3;
LAB_00119cdd:
              SDL_memset(pfVar21,0,iVar35);
            }
            audio = local_40;
            pLVar30 = local_50;
            if (((pFVar9->field_19).src.curBufferOffsetDec != 0) &&
               (uVar15 = (pFVar9->field_19).src.totalSamples, uVar15 != 0)) {
              (pFVar9->field_19).src.totalSamples = uVar15 - 1;
            }
            pFVar10 = (pFVar9->field_19).src.callback;
            if ((pFVar10 != (FAudioVoiceCallback *)0x0) &&
               (pFVar10->OnVoiceProcessingPassEnd != (OnVoiceProcessingPassEndFunc)0x0)) {
              FAudio_PlatformUnlockMutex((pFVar9->field_19).src.bufferLock);
              FAudio_PlatformUnlockMutex(pFVar9->sendLock);
              FAudio_PlatformUnlockMutex(pFVar9->audio->sourceLock);
              pFVar10 = (pFVar9->field_19).src.callback;
              (*pFVar10->OnVoiceProcessingPassEnd)(pFVar10);
              FAudio_PlatformLockMutex(pFVar9->audio->sourceLock);
              FAudio_PlatformLockMutex(pFVar9->sendLock);
              FAudio_PlatformLockMutex((pFVar9->field_19).src.bufferLock);
            }
            if (uVar22 != 0) {
              uVar25 = (pFVar9->field_19).src.resampleStep;
              uVar33 = ((uVar22 << 0x20 | 0xffffffff) - (pFVar9->field_19).src.curBufferOffsetDec) /
                       uVar25 + 2;
              uVar18 = (pFVar9->field_19).src.resampleSamples;
              if (uVar18 <= uVar33) {
                uVar33 = (ulong)uVar18;
              }
              pFVar29 = pFVar9->audio;
              if (uVar25 == 0x100000000) {
                ppfVar23 = &pFVar29->decodeCache;
              }
              else {
                uVar18 = ((pFVar9->field_19).src.format)->nChannels * uVar18;
                if (pFVar29->resampleSamples < uVar18) {
                  pFVar29->resampleSamples = uVar18;
                  pfVar21 = (float *)(*pFVar29->pRealloc)(pFVar29->resampleCache,(ulong)uVar18 << 2)
                  ;
                  pFVar29->resampleCache = pfVar21;
                }
                (*(pFVar9->field_19).src.resample)
                          (pFVar9->audio->decodeCache,pFVar9->audio->resampleCache,
                           &(pFVar9->field_19).src.resampleOffset,
                           (pFVar9->field_19).src.resampleStep,uVar33,
                           (uint8_t)((pFVar9->field_19).src.format)->nChannels);
                ppfVar23 = &pFVar9->audio->resampleCache;
              }
              pfVar21 = *ppfVar23;
              if ((pFVar9->field_19).src.bufferList == (FAudioBufferEntry *)0x0) {
                (pFVar9->field_19).src.curBufferOffsetDec = 0;
                (pFVar9->field_19).src.curBufferOffset = 0;
              }
              else {
                uVar18 = (pFVar9->field_19).master.inputChannels * (int)uVar33 +
                         (pFVar9->field_19).mix.inputChannels;
                *(ulong *)((long)&pFVar9->field_19 + 0x20) = (ulong)uVar18;
                if ((uVar18 != 0) && (uVar37 = (pFVar9->field_19).src.curBufferOffset, uVar37 != 0))
                {
                  (pFVar9->field_19).src.curBufferOffset = uVar37 - 1;
                }
              }
              FAudio_PlatformUnlockMutex((pFVar9->field_19).src.bufferLock);
              local_60 = CONCAT44(local_60._4_4_,(int)uVar33);
              goto LAB_00119f35;
            }
            FAudio_PlatformUnlockMutex((pFVar9->field_19).src.bufferLock);
            FAudio_PlatformUnlockMutex(pFVar9->sendLock);
          }
        }
        FAudio_INTERNAL_FlushPendingBuffers(audio->processingSource);
      }
    }
    audio->processingSource = (FAudioSourceVoice *)0x0;
    FAudio_PlatformUnlockMutex(audio->sourceLock);
    FAudio_PlatformLockMutex(audio->submixLock);
    for (pLVar30 = audio->submixes; pFVar29 = local_40, pLVar30 != (LinkedList *)0x0;
        pLVar30 = pLVar30->next) {
      pFVar9 = (FAudioVoice *)pLVar30->entry;
      local_60 = 0;
      FAudio_PlatformLockMutex(pFVar9->sendLock);
      if ((pFVar9->field_19).src.resampleStep == 0x100000000) {
        ppfVar23 = &(pFVar9->field_19).mix.inputCache;
      }
      else {
        pFVar29 = pFVar9->audio;
        uVar18 = (pFVar9->field_19).mix.inputChannels * (pFVar9->field_19).src.resampleSamples;
        if (pFVar29->resampleSamples < uVar18) {
          pFVar29->resampleSamples = uVar18;
          pfVar21 = (float *)(*pFVar29->pRealloc)(pFVar29->resampleCache,(ulong)uVar18 << 2);
          pFVar29->resampleCache = pfVar21;
        }
        (*(pFVar9->field_19).mix.resample)
                  ((pFVar9->field_19).mix.inputCache,pFVar9->audio->resampleCache,&local_60,
                   (pFVar9->field_19).src.resampleStep,(ulong)(pFVar9->field_19).src.resampleSamples
                   ,*(uint8_t *)((long)&pFVar9->field_19 + 0x20));
        ppfVar23 = &pFVar9->audio->resampleCache;
      }
      pfVar21 = *ppfVar23;
      uVar37 = (pFVar9->field_19).mix.inputChannels * (pFVar9->field_19).src.resampleSamples;
      fVar3 = pFVar9->volume;
      if ((fVar3 != 1.0) || (NAN(fVar3))) {
        local_44 = uVar37;
        (*FAudio_INTERNAL_Amplify)(pfVar21,uVar37,fVar3);
      }
      uVar18 = (pFVar9->field_19).mix.inputChannels;
      uVar19 = uVar37 / uVar18;
      local_44 = uVar19;
      if ((pFVar9->flags & 8) != 0) {
        FAudio_PlatformLockMutex(pFVar9->filterLock);
        if (uVar18 <= uVar37) {
          pafVar16 = pFVar9->filterState;
          uVar4 = *(ushort *)((long)&pFVar9->field_19 + 0x20);
          uVar25 = 0;
          uVar18 = 0;
          do {
            iVar35 = (int)uVar25;
            if (uVar4 != 0) {
              FVar6 = (pFVar9->filter).Type;
              lVar36 = 0;
              do {
                fVar3 = *(float *)((long)*pafVar16 + lVar36 + 4);
                fVar40 = (pFVar9->filter).Frequency * fVar3 + *(float *)((long)*pafVar16 + lVar36);
                *(float *)((long)*pafVar16 + lVar36) = fVar40;
                fVar41 = (pfVar21[uVar25] - fVar40) - (pFVar9->filter).OneOverQ * fVar3;
                *(float *)((long)*pafVar16 + lVar36 + 8) = fVar41;
                *(float *)((long)*pafVar16 + lVar36 + 4) =
                     fVar41 * (pFVar9->filter).Frequency + fVar3;
                *(float *)((long)*pafVar16 + lVar36 + 0xc) = fVar40 + fVar41;
                pfVar21[uVar25] = *(float *)((long)*pafVar16 + lVar36 + (ulong)FVar6 * 4);
                lVar36 = lVar36 + 0x10;
                uVar25 = (ulong)((int)uVar25 + 1);
              } while ((ulong)uVar4 << 4 != lVar36);
            }
            uVar18 = uVar18 + 1;
            uVar25 = (ulong)(iVar35 + (uint)uVar4);
          } while (uVar18 != uVar19);
        }
        FAudio_PlatformUnlockMutex(pFVar9->filterLock);
      }
      FAudio_PlatformLockMutex(pFVar9->effectLock);
      if ((pFVar9->effects).count != 0) {
        pfVar21 = FAudio_INTERNAL_ProcessEffectChain(pFVar9,pfVar21,&local_44);
      }
      FAudio_PlatformUnlockMutex(pFVar9->effectLock);
      if ((pFVar9->sends).SendCount != 0) {
        local_50 = pLVar30;
        FAudio_PlatformLockMutex(pFVar9->volumeLock);
        uVar18 = local_44;
        if ((pFVar9->sends).SendCount != 0) {
          uVar25 = 0;
          do {
            pFVar17 = (pFVar9->sends).pSends[uVar25].pOutputVoice;
            bVar39 = pFVar17->type != FAUDIO_VOICE_MASTER;
            pfVar24 = *(float **)((long)&pFVar17->field_19 + (ulong)bVar39 * 8);
            uVar19 = *(uint *)((long)&pFVar17->field_19 + (ulong)bVar39 * 0x10 + 0x10);
            local_58 = (ulong)uVar19;
            (*pFVar9->sendMix[uVar25])
                      (uVar18,pFVar9->outputChannels,uVar19,pfVar21,pfVar24,
                       pFVar9->mixCoefficients[uVar25]);
            if ((((pFVar9->sends).pSends[uVar25].Flags & 0x80) != 0) && (uVar18 != 0)) {
              pFVar27 = pFVar9->sendFilter + uVar25;
              pafVar16 = pFVar9->sendFilterState[uVar25];
              uVar33 = 0;
              uVar37 = 0;
              do {
                iVar35 = (int)uVar33;
                if ((ushort)local_58 != 0) {
                  FVar6 = pFVar27->Type;
                  lVar36 = 0;
                  do {
                    fVar3 = *(float *)((long)*pafVar16 + lVar36 + 4);
                    fVar40 = pFVar27->Frequency * fVar3 + *(float *)((long)*pafVar16 + lVar36);
                    *(float *)((long)*pafVar16 + lVar36) = fVar40;
                    fVar41 = (pfVar24[uVar33] - fVar40) - pFVar27->OneOverQ * fVar3;
                    *(float *)((long)*pafVar16 + lVar36 + 8) = fVar41;
                    *(float *)((long)*pafVar16 + lVar36 + 4) = fVar41 * pFVar27->Frequency + fVar3;
                    *(float *)((long)*pafVar16 + lVar36 + 0xc) = fVar40 + fVar41;
                    pfVar24[uVar33] = *(float *)((long)*pafVar16 + lVar36 + (ulong)FVar6 * 4);
                    lVar36 = lVar36 + 0x10;
                    uVar33 = (ulong)((int)uVar33 + 1);
                  } while ((local_58 & 0xffff) << 4 != lVar36);
                }
                uVar37 = uVar37 + 1;
                uVar33 = (ulong)(iVar35 + (uint)(ushort)local_58);
              } while (uVar37 != uVar18);
            }
            uVar25 = uVar25 + 1;
          } while (uVar25 < (pFVar9->sends).SendCount);
        }
        FAudio_PlatformUnlockMutex(pFVar9->volumeLock);
        pLVar30 = local_50;
      }
      FAudio_PlatformUnlockMutex(pFVar9->sendLock);
      SDL_memset((pFVar9->field_19).mix.inputCache,0,
                 (ulong)(pFVar9->field_19).src.decodeSamples << 2);
    }
    FAudio_PlatformUnlockMutex(local_40->submixLock);
    pfVar21 = local_38;
    pFVar8 = pFVar29->master;
    fVar3 = pFVar8->volume;
    if ((fVar3 != 1.0) || (NAN(fVar3))) {
      (*FAudio_INTERNAL_Amplify)
                ((pFVar8->field_19).master.output,
                 (pFVar8->field_19).master.inputChannels * pFVar29->updateSize,fVar3);
    }
    FAudio_PlatformLockMutex(pFVar29->master->effectLock);
    pFVar9 = pFVar29->master;
    if ((pFVar9->effects).count != 0) {
      local_60 = CONCAT44(local_60._4_4_,pFVar29->updateSize);
      pfVar24 = FAudio_INTERNAL_ProcessEffectChain
                          (pFVar9,(pFVar9->field_19).master.output,(uint32_t *)&local_60);
      if (pfVar24 != pfVar21) {
        SDL_memcpy(pfVar21,pfVar24,(ulong)(pFVar29->master->outputChannels * (uint)local_60) << 2);
      }
      uVar18 = pFVar29->updateSize - (uint)local_60;
      if ((uint)local_60 <= pFVar29->updateSize && uVar18 != 0) {
        SDL_memset(pfVar21 + (uint)local_60 * pFVar29->master->outputChannels,0,(ulong)uVar18 << 2);
      }
    }
    FAudio_PlatformUnlockMutex(pFVar29->master->effectLock);
    FAudio_PlatformLockMutex(pFVar29->callbackLock);
    for (pLVar30 = pFVar29->callbacks; pLVar30 != (LinkedList *)0x0; pLVar30 = pLVar30->next) {
      pcVar7 = *(code **)((long)pLVar30->entry + 8);
      if (pcVar7 != (code *)0x0) {
        (*pcVar7)();
      }
    }
    FAudio_PlatformUnlockMutex(pFVar29->callbackLock);
  }
  return;
}

Assistant:

static void FAUDIOCALL FAudio_INTERNAL_GenerateOutput(FAudio *audio, float *output)
{
	uint32_t totalSamples;
	LinkedList *list;
	float *effectOut;
	FAudioEngineCallback *callback;

	LOG_FUNC_ENTER(audio)
	if (!audio->active)
	{
		LOG_FUNC_EXIT(audio)
		return;
	}

	/* Apply any committed changes */
	FAudio_OPERATIONSET_Execute(audio);

	/* ProcessingPassStart callbacks */
	FAudio_PlatformLockMutex(audio->callbackLock);
	LOG_MUTEX_LOCK(audio, audio->callbackLock)
	list = audio->callbacks;
	while (list != NULL)
	{
		callback = (FAudioEngineCallback*) list->entry;
		if (callback->OnProcessingPassStart != NULL)
		{
			callback->OnProcessingPassStart(
				callback
			);
		}
		list = list->next;
	}
	FAudio_PlatformUnlockMutex(audio->callbackLock);
	LOG_MUTEX_UNLOCK(audio, audio->callbackLock)

	/* Writes to master will directly write to output, but ONLY if there
	 * isn't any channel-changing effect processing to do first.
	 */
	if (audio->master->master.effectCache != NULL)
	{
		audio->master->master.output = audio->master->master.effectCache;
		FAudio_zero(
			audio->master->master.effectCache,
			(
				sizeof(float) *
				audio->updateSize *
				audio->master->master.inputChannels
			)
		);
	}
	else
	{
		audio->master->master.output = output;
	}

	/* Mix sources */
	FAudio_PlatformLockMutex(audio->sourceLock);
	LOG_MUTEX_LOCK(audio, audio->sourceLock)
	list = audio->sources;
	while (list != NULL)
	{
		audio->processingSource = (FAudioSourceVoice*) list->entry;

		FAudio_INTERNAL_FlushPendingBuffers(audio->processingSource);
		if (audio->processingSource->src.active)
		{
			FAudio_INTERNAL_MixSource(audio->processingSource);
			FAudio_INTERNAL_FlushPendingBuffers(audio->processingSource);
		}

		list = list->next;
	}
	audio->processingSource = NULL;
	FAudio_PlatformUnlockMutex(audio->sourceLock);
	LOG_MUTEX_UNLOCK(audio, audio->sourceLock)

	/* Mix submixes, ordered by processing stage */
	FAudio_PlatformLockMutex(audio->submixLock);
	LOG_MUTEX_LOCK(audio, audio->submixLock)
	list = audio->submixes;
	while (list != NULL)
	{
		FAudio_INTERNAL_MixSubmix((FAudioSubmixVoice*) list->entry);
		list = list->next;
	}
	FAudio_PlatformUnlockMutex(audio->submixLock);
	LOG_MUTEX_UNLOCK(audio, audio->submixLock)

	/* Apply master volume */
	if (audio->master->volume != 1.0f)
	{
		FAudio_INTERNAL_Amplify(
			audio->master->master.output,
			audio->updateSize * audio->master->master.inputChannels,
			audio->master->volume
		);
	}

	/* Process master effect chain */
	FAudio_PlatformLockMutex(audio->master->effectLock);
	LOG_MUTEX_LOCK(audio, audio->master->effectLock)
	if (audio->master->effects.count > 0)
	{
		totalSamples = audio->updateSize;
		effectOut = FAudio_INTERNAL_ProcessEffectChain(
			audio->master,
			audio->master->master.output,
			&totalSamples
		);

		if (effectOut != output)
		{
			FAudio_memcpy(
				output,
				effectOut,
				totalSamples * audio->master->outputChannels * sizeof(float)
			);
		}
		if (totalSamples < audio->updateSize)
		{
			FAudio_zero(
				output + (totalSamples * audio->master->outputChannels),
				(audio->updateSize - totalSamples) * sizeof(float)
			);
		}
	}
	FAudio_PlatformUnlockMutex(audio->master->effectLock);
	LOG_MUTEX_UNLOCK(audio, audio->master->effectLock)

	/* OnProcessingPassEnd callbacks */
	FAudio_PlatformLockMutex(audio->callbackLock);
	LOG_MUTEX_LOCK(audio, audio->callbackLock)
	list = audio->callbacks;
	while (list != NULL)
	{
		callback = (FAudioEngineCallback*) list->entry;
		if (callback->OnProcessingPassEnd != NULL)
		{
			callback->OnProcessingPassEnd(
				callback
			);
		}
		list = list->next;
	}
	FAudio_PlatformUnlockMutex(audio->callbackLock);
	LOG_MUTEX_UNLOCK(audio, audio->callbackLock)

	LOG_FUNC_EXIT(audio)
}